

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateLimiter.h
# Opt level: O3

bool __thiscall
jaegertracing::utils::RateLimiter<std::chrono::_V2::steady_clock>::checkCredit
          (RateLimiter<std::chrono::_V2::steady_clock> *this,double itemCost)

{
  long lVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = (this->_lastTick).__d.__r;
  (this->_lastTick).__d.__r = lVar4;
  dVar5 = ((double)(lVar4 - lVar1) / 1000000000.0) * this->_creditsPerSecond + this->_balance;
  this->_balance = dVar5;
  dVar2 = this->_maxBalance;
  if ((this->_maxBalance < dVar5) || (dVar2 = dVar5, itemCost <= dVar5)) {
    this->_balance =
         (double)(~-(ulong)(itemCost <= dVar2) & (ulong)dVar2 |
                 (ulong)(dVar2 - itemCost) & -(ulong)(itemCost <= dVar2));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return itemCost <= dVar2;
}

Assistant:

bool checkCredit(double itemCost)
    {
        std::lock_guard<std::mutex> lock(_mutex);
        const auto currentTime = Clock::now();
        const auto elapsedTime =
            std::chrono::duration<double>(currentTime - _lastTick);
        _lastTick = currentTime;

        _balance += elapsedTime.count() * _creditsPerSecond;
        if (_balance > _maxBalance) {
            _balance = _maxBalance;
        }

        if (_balance >= itemCost) {
            _balance -= itemCost;
            return true;
        }

        return false;
    }